

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_CreateBlockMap(void)

{
  long lVar1;
  void *__s;
  int *piVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  TArray<int,_int> *pTVar15;
  ulong uVar16;
  uint uVar17;
  TArray<int,_int> *pTVar18;
  TArray<int,_int> *this;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long *plVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  TArray<int,_int> BlockMap;
  TArray<int,_int> local_40d0;
  ulong local_40c0;
  uint local_40b4;
  uint local_40b0;
  int local_40ac;
  long *local_40a8;
  long local_40a0;
  long local_4098;
  int local_408c;
  int local_4088;
  int local_4084;
  long local_4080;
  TArray<int,_int> *local_4078;
  long local_4070;
  long local_4068;
  ulong local_4060;
  long *local_4058;
  ulong local_4050;
  ulong local_4048;
  long local_4040;
  int local_4038 [4098];
  
  if (0 < numvertexes) {
    dVar26 = (vertexes->p).X;
    dVar24 = (vertexes->p).Y;
    dVar27 = dVar24;
    dVar28 = dVar26;
    if (numvertexes != 1) {
      lVar10 = 0x38;
      dVar23 = dVar24;
      dVar25 = dVar26;
      do {
        dVar24 = *(double *)((long)&(vertexes->p).X + lVar10);
        dVar26 = dVar24;
        if ((dVar25 <= dVar24) && (dVar26 = dVar25, dVar28 < dVar24)) {
          dVar28 = dVar24;
        }
        dVar25 = *(double *)((long)&(vertexes->p).Y + lVar10);
        dVar24 = dVar25;
        if ((dVar23 <= dVar25) && (dVar24 = dVar23, dVar27 < dVar25)) {
          dVar27 = dVar25;
        }
        lVar10 = lVar10 + 0x38;
        dVar23 = dVar24;
        dVar25 = dVar26;
      } while ((ulong)(uint)numvertexes * 0x38 - lVar10 != 0);
    }
    iVar19 = (int)dVar26;
    local_4084 = (int)dVar24;
    iVar6 = (int)dVar28 - iVar19 >> 7;
    local_40ac = iVar6 + 1;
    local_408c = ((int)dVar27 - local_4084 >> 7) + 1;
    uVar20 = local_40ac * local_408c;
    local_40d0.Most = uVar20 * 3 + 4;
    local_40d0.Count = 0;
    local_40d0.Array =
         (int *)M_Malloc_Dbg((long)(int)(uVar20 * 3) * 4 + 0x10,
                             "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                             ,0x91);
    TArray<int,_int>::Grow(&local_40d0,1);
    local_40d0.Array[local_40d0.Count] = iVar19;
    local_40d0.Count = local_40d0.Count + 1;
    TArray<int,_int>::Grow(&local_40d0,1);
    local_40d0.Array[local_40d0.Count] = local_4084;
    local_40d0.Count = local_40d0.Count + 1;
    TArray<int,_int>::Grow(&local_40d0,1);
    local_40d0.Array[local_40d0.Count] = local_40ac;
    local_40d0.Count = local_40d0.Count + 1;
    TArray<int,_int>::Grow(&local_40d0,1);
    local_40d0.Array[local_40d0.Count] = local_408c;
    local_40d0.Count = local_40d0.Count + 1;
    lVar10 = (long)(int)uVar20;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar20) {
      uVar4 = lVar10 * 0x10 + 8;
    }
    local_4058 = (long *)operator_new__(uVar4);
    *local_4058 = lVar10;
    plVar22 = local_4058 + 1;
    local_4050 = (ulong)uVar20;
    if (uVar20 != 0) {
      memset(plVar22,0,lVar10 * 0x10);
    }
    local_40a8 = plVar22;
    if (0 < numlines) {
      local_4040 = (long)iVar6 * 0x10 + 0x10;
      uVar4 = 0;
      local_40a0 = lVar10;
      local_4088 = iVar19;
      do {
        lVar10 = local_40a0;
        iVar11 = (int)((lines[uVar4].v1)->p).X;
        iVar5 = (int)((lines[uVar4].v1)->p).Y;
        iVar6 = (int)((lines[uVar4].v2)->p).X;
        iVar3 = (int)((lines[uVar4].v2)->p).Y;
        local_40b4 = iVar11 - iVar19;
        uVar20 = (int)local_40b4 >> 7;
        uVar7 = iVar5 - local_4084;
        local_4098 = CONCAT44(local_4098._4_4_,uVar7);
        uVar8 = (int)uVar7 >> 7;
        local_40b0 = iVar6 - iVar19 >> 7;
        uVar17 = iVar3 - local_4084 >> 7;
        iVar13 = uVar8 * local_40ac + uVar20;
        this = (TArray<int,_int> *)(plVar22 + (long)iVar13 * 2);
        iVar14 = uVar17 * local_40ac + local_40b0;
        local_40c0 = uVar4;
        if (iVar13 == iVar14) {
          TArray<int,_int>::Grow(this,1);
          lVar10 = local_40a0;
LAB_0053ac58:
          this->Array[this->Count] = (int)local_40c0;
          this->Count = this->Count + 1;
        }
        else {
          pTVar15 = (TArray<int,_int> *)(plVar22 + (long)iVar14 * 2);
          local_4080 = CONCAT44(local_4080._4_4_,uVar17);
          if (uVar8 == uVar17) {
            pTVar18 = this;
            if ((int)local_40b0 < (int)uVar20) {
              pTVar18 = pTVar15;
              pTVar15 = this;
            }
            do {
              TArray<int,_int>::Grow(pTVar18,1);
              pTVar18->Array[pTVar18->Count] = (int)local_40c0;
              pTVar18->Count = pTVar18->Count + 1;
              pTVar18 = pTVar18 + 1;
            } while (pTVar18 <= pTVar15);
          }
          else {
            local_4078 = pTVar15;
            if (uVar20 != local_40b0) {
              iVar6 = iVar6 - iVar11;
              iVar3 = iVar3 - iVar5;
              iVar19 = -iVar6;
              if (0 < iVar6) {
                iVar19 = iVar6;
              }
              iVar5 = -iVar3;
              if (0 < iVar3) {
                iVar5 = iVar3;
              }
              if (iVar19 == iVar5) {
                uVar17 = 0x80 - (local_40b4 & 0x7f);
                if (-1 < iVar6) {
                  uVar17 = local_40b4 & 0x7f;
                }
                uVar21 = 0x80 - (uVar7 & 0x7f);
                if (-1 < iVar3) {
                  uVar21 = uVar7 & 0x7f;
                }
                iVar19 = iVar19 - (uint)(uVar17 < uVar21);
              }
              uVar17 = iVar6 >> 0x1f | 1;
              uVar21 = iVar3 >> 0x1f | 1;
              iVar11 = uVar21 * local_40ac;
              if (iVar19 < iVar5) {
                local_40b4 = (iVar6 >> 0x1f | 0x80U) - local_40b4;
                local_4080 = (long)iVar3;
                local_4068 = (long)iVar6;
                local_4070 = (long)(int)uVar17;
                uVar4 = (ulong)uVar20;
                do {
                  iVar6 = (int)(((int)((int)uVar4 * 0x80 + local_40b4) * local_4080) / local_4068) +
                          (int)local_4098;
                  iVar19 = (int)local_40c0;
                  local_4060 = uVar4;
                  pTVar15 = this;
                  for (; uVar8 != iVar6 >> 7; uVar8 = uVar8 + uVar21) {
                    TArray<int,_int>::Grow(pTVar15,1);
                    pTVar15->Array[pTVar15->Count] = iVar19;
                    pTVar15->Count = pTVar15->Count + 1;
                    pTVar15 = pTVar15 + iVar11;
                  }
                  TArray<int,_int>::Grow(pTVar15,1);
                  pTVar18 = local_4078;
                  lVar10 = local_40a0;
                  pTVar15->Array[pTVar15->Count] = iVar19;
                  pTVar15->Count = pTVar15->Count + 1;
                  this = pTVar15 + local_4070;
                  uVar4 = local_4060 + local_4070;
                } while (local_40b0 != (uint)uVar4);
                if (this != local_4078) {
                  this = pTVar15 + local_4070;
                  do {
                    TArray<int,_int>::Grow(this,1);
                    this->Array[this->Count] = (int)local_40c0;
                    this->Count = this->Count + 1;
                    this = this + iVar11;
                  } while (this != pTVar18);
                }
                TArray<int,_int>::Grow(this,1);
                plVar22 = local_40a8;
                iVar19 = local_4088;
              }
              else {
                local_40b0 = (iVar3 >> 0x1f | 0x80U) - uVar7;
                local_4098 = (long)iVar6;
                local_4068 = (long)iVar3;
                local_4070 = (long)iVar11;
                uVar4 = (ulong)uVar8;
                local_4048 = (ulong)uVar21;
                do {
                  iVar6 = (int)(((int)((int)uVar4 * 0x80 + local_40b0) * local_4098) / local_4068) +
                          local_40b4;
                  iVar19 = (int)local_40c0;
                  local_4060 = uVar4;
                  pTVar15 = this;
                  for (; uVar20 != iVar6 >> 7; uVar20 = uVar20 + uVar17) {
                    TArray<int,_int>::Grow(pTVar15,1);
                    pTVar15->Array[pTVar15->Count] = iVar19;
                    pTVar15->Count = pTVar15->Count + 1;
                    pTVar15 = pTVar15 + (int)uVar17;
                  }
                  TArray<int,_int>::Grow(pTVar15,1);
                  pTVar18 = local_4078;
                  lVar10 = local_40a0;
                  pTVar15->Array[pTVar15->Count] = iVar19;
                  pTVar15->Count = pTVar15->Count + 1;
                  this = pTVar15 + local_4070;
                  uVar4 = local_4060 + local_4048;
                } while ((int)local_4080 != (int)uVar4);
                if (this != local_4078) {
                  this = pTVar15 + local_4070;
                  do {
                    TArray<int,_int>::Grow(this,1);
                    this->Array[this->Count] = (int)local_40c0;
                    this->Count = this->Count + 1;
                    this = this + (int)uVar17;
                  } while (this != pTVar18);
                }
                TArray<int,_int>::Grow(this,1);
                plVar22 = local_40a8;
                iVar19 = local_4088;
              }
              goto LAB_0053ac58;
            }
            pTVar18 = this;
            if ((int)uVar17 < (int)uVar8) {
              pTVar18 = pTVar15;
              pTVar15 = this;
            }
            do {
              TArray<int,_int>::Grow(pTVar18,1);
              pTVar18->Array[pTVar18->Count] = (int)local_40c0;
              pTVar18->Count = pTVar18->Count + 1;
              pTVar18 = (TArray<int,_int> *)((long)&pTVar18->Array + local_4040);
            } while (pTVar18 <= pTVar15);
          }
        }
        uVar4 = local_40c0 + 1;
      } while ((long)uVar4 < (long)numlines);
    }
    uVar4 = local_4050;
    uVar20 = (uint)local_4050;
    TArray<int,_int>::Grow(&local_40d0,uVar20);
    local_40d0.Count = local_40d0.Count + uVar20;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar20) {
      uVar9 = lVar10 << 2;
    }
    __s = operator_new__(uVar9);
    memset(__s,0xff,(long)local_408c * (long)local_40ac * 4);
    memset(local_4038,0xff,0x4000);
    if (0 < (int)uVar20) {
      local_40c0 = uVar4 & 0xffffffff;
      uVar4 = 0;
      do {
        uVar20 = *(uint *)((long)local_40a8 + uVar4 * 0x10 + 0xc);
        uVar9 = (ulong)uVar20;
        if (uVar9 == 0) {
          uVar12 = 0;
        }
        else {
          uVar12 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 * 0x2fcb + *(int *)(local_40a8[uVar4 * 2] + uVar12 * 4);
            uVar12 = uVar12 + 1;
          } while (uVar9 != uVar12);
          uVar12 = (ulong)(uVar8 & 0xfff);
        }
        iVar19 = local_4038[uVar12];
        while (iVar19 != -1) {
          lVar10 = (long)iVar19;
          uVar8 = *(uint *)((long)local_40a8 + lVar10 * 0x10 + 0xc);
          if ((uVar9 == 0) || (uVar20 != uVar8)) {
            if (uVar20 == uVar8) {
LAB_0053b1da:
              local_40d0.Array[uVar4 + 4] = local_40d0.Array[lVar10 + 4];
              goto LAB_0053b1e8;
            }
          }
          else {
            uVar16 = 0;
            while (*(int *)(local_40a8[uVar4 * 2] + uVar16 * 4) ==
                   *(int *)(local_40a8[lVar10 * 2] + uVar16 * 4)) {
              uVar16 = uVar16 + 1;
              if (uVar9 == uVar16) goto LAB_0053b1da;
            }
          }
          iVar19 = *(int *)((long)__s + lVar10 * 4);
        }
        *(int *)((long)__s + uVar4 * 4) = local_4038[uVar12];
        local_4038[uVar12] = (int)uVar4;
        local_40d0.Array[uVar4 + 4] = local_40d0.Count;
        TArray<int,_int>::Grow(&local_40d0,1);
        local_40d0.Array[local_40d0.Count] = 0;
        local_40d0.Count = local_40d0.Count + 1;
        plVar22 = local_40a8 + uVar4 * 2;
        if (*(int *)((long)plVar22 + 0xc) != 0) {
          lVar10 = *plVar22;
          uVar9 = 0;
          do {
            TArray<int,_int>::Grow(&local_40d0,1);
            local_40d0.Array[local_40d0.Count] = *(int *)(lVar10 + uVar9 * 4);
            local_40d0.Count = local_40d0.Count + 1;
            uVar9 = uVar9 + 1;
          } while (uVar9 < *(uint *)((long)plVar22 + 0xc));
        }
        TArray<int,_int>::Grow(&local_40d0,1);
        local_40d0.Array[local_40d0.Count] = -1;
        local_40d0.Count = local_40d0.Count + 1;
LAB_0053b1e8:
        uVar4 = uVar4 + 1;
      } while (uVar4 != local_40c0);
    }
    operator_delete__(__s);
    plVar22 = local_4058;
    lVar10 = *local_4058 * 0x10;
    uVar4 = lVar10 + 8;
    lVar1 = *local_4058;
    while (lVar1 != 0) {
      TArray<int,_int>::~TArray((TArray<int,_int> *)((long)plVar22 + lVar10 + -8));
      lVar10 = lVar10 + -0x10;
      lVar1 = lVar10;
    }
    operator_delete__(plVar22,uVar4);
    piVar2 = (int *)operator_new__((ulong)local_40d0.Count << 2);
    blockmaplump = piVar2;
    if ((ulong)local_40d0.Count != 0) {
      uVar4 = 0;
      do {
        piVar2[uVar4] = local_40d0.Array[uVar4];
        uVar4 = uVar4 + 1;
      } while (local_40d0.Count != uVar4);
    }
    TArray<int,_int>::~TArray(&local_40d0);
  }
  return;
}

Assistant:

static void P_CreateBlockMap ()
{
	TArray<int> *BlockLists, *block, *endblock;
	int adder;
	int bmapwidth, bmapheight;
	double dminx, dmaxx, dminy, dmaxy;
	int minx, maxx, miny, maxy;
	int i;
	int line;

	if (numvertexes <= 0)
		return;

	// Find map extents for the blockmap
	dminx = dmaxx = vertexes[0].fX();
	dminy = dmaxy = vertexes[0].fY();

	for (i = 1; i < numvertexes; ++i)
	{
			 if (vertexes[i].fX() < dminx) dminx = vertexes[i].fX();
		else if (vertexes[i].fX() > dmaxx) dmaxx = vertexes[i].fX();
			 if (vertexes[i].fY() < dminy) dminy = vertexes[i].fY();
		else if (vertexes[i].fY() > dmaxy) dmaxy = vertexes[i].fY();
	}

	minx = int(dminx);
	miny = int(dminy);
	maxx = int(dmaxx);
	maxy = int(dmaxy);

	bmapwidth =	 ((maxx - minx) >> BLOCKBITS) + 1;
	bmapheight = ((maxy - miny) >> BLOCKBITS) + 1;

	TArray<int> BlockMap (bmapwidth * bmapheight * 3 + 4);

	adder = minx;			BlockMap.Push (adder);
	adder = miny;			BlockMap.Push (adder);
	adder = bmapwidth;		BlockMap.Push (adder);
	adder = bmapheight;		BlockMap.Push (adder);

	BlockLists = new TArray<int>[bmapwidth * bmapheight];

	for (line = 0; line < numlines; ++line)
	{
		int x1 = int(lines[line].v1->fX());
		int y1 = int(lines[line].v1->fY());
		int x2 = int(lines[line].v2->fX());
		int y2 = int(lines[line].v2->fY());
		int dx = x2 - x1;
		int dy = y2 - y1;
		int bx = (x1 - minx) >> BLOCKBITS;
		int by = (y1 - miny) >> BLOCKBITS;
		int bx2 = (x2 - minx) >> BLOCKBITS;
		int by2 = (y2 - miny) >> BLOCKBITS;

		block = &BlockLists[bx + by * bmapwidth];
		endblock = &BlockLists[bx2 + by2 * bmapwidth];

		if (block == endblock)	// Single block
		{
			block->Push (line);
		}
		else if (by == by2)		// Horizontal line
		{
			if (bx > bx2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += 1;
			} while (block <= endblock);
		}
		else if (bx == bx2)	// Vertical line
		{
			if (by > by2)
			{
				swapvalues (block, endblock);
			}
			do
			{
				block->Push (line);
				block += bmapwidth;
			} while (block <= endblock);
		}
		else				// Diagonal line
		{
			int xchange = (dx < 0) ? -1 : 1;
			int ychange = (dy < 0) ? -1 : 1;
			int ymove = ychange * bmapwidth;
			int adx = abs (dx);
			int ady = abs (dy);

			if (adx == ady)		// 45 degrees
			{
				int xb = (x1 - minx) & (BLOCKSIZE-1);
				int yb = (y1 - miny) & (BLOCKSIZE-1);
				if (dx < 0)
				{
					xb = BLOCKSIZE-xb;
				}
				if (dy < 0)
				{
					yb = BLOCKSIZE-yb;
				}
				if (xb < yb)
					adx--;
			}
			if (adx >= ady)		// X-major
			{
				int yadd = dy < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((by << BLOCKBITS) + yadd - (y1 - miny), dx, dy) + (x1 - minx)) >> BLOCKBITS;
					while (bx != stop)
					{
						block->Push (line);
						block += xchange;
						bx += xchange;
					}
					block->Push (line);
					block += ymove;
					by += ychange;
				} while (by != by2);
				while (block != endblock)
				{
					block->Push (line);
					block += xchange;
				}
				block->Push (line);
			}
			else					// Y-major
			{
				int xadd = dx < 0 ? -1 : BLOCKSIZE;
				do
				{
					int stop = (Scale ((bx << BLOCKBITS) + xadd - (x1 - minx), dy, dx) + (y1 - miny)) >> BLOCKBITS;
					while (by != stop)
					{
						block->Push (line);
						block += ymove;
						by += ychange;
					}
					block->Push (line);
					block += xchange;
					bx += xchange;
				} while (bx != bx2);
				while (block != endblock)
				{
					block->Push (line);
					block += ymove;
				}
				block->Push (line);
			}
		}
	}

	BlockMap.Reserve (bmapwidth * bmapheight);
	CreatePackedBlockmap (BlockMap, BlockLists, bmapwidth, bmapheight);
	delete[] BlockLists;

	blockmaplump = new int[BlockMap.Size()];
	for (unsigned int ii = 0; ii < BlockMap.Size(); ++ii)
	{
		blockmaplump[ii] = BlockMap[ii];
	}
}